

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O0

void __thiscall qpdf::Tokenizer::inLt(Tokenizer *this,char ch)

{
  char ch_local;
  Tokenizer *this_local;
  
  if (ch == '<') {
    this->type = tt_dict_open;
    this->state = st_token_ready;
  }
  else {
    this->state = st_in_hexstring;
    inHexstring(this,ch);
  }
  return;
}

Assistant:

void
Tokenizer::inLt(char ch)
{
    if (ch == '<') {
        type = tt::tt_dict_open;
        state = st_token_ready;
        return;
    }

    state = st_in_hexstring;
    inHexstring(ch);
}